

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O2

char * __thiscall ContinuousPageStack<1UL>::Pop(ContinuousPageStack<1UL> *this,size_t size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar4 = this->nextTop;
  if (uVar4 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    if (size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfc,"(size != 0)","size != 0");
      if (!bVar2) goto LAB_00d49cbd;
      *puVar3 = 0;
      uVar4 = this->nextTop;
    }
    if (uVar4 < size) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfd,"(nextTop >= size)","nextTop >= size");
      if (!bVar2) {
LAB_00d49cbd:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      uVar4 = this->nextTop;
    }
    this->nextTop = uVar4 - size;
    pcVar5 = Buffer(this);
    pcVar5 = pcVar5 + this->nextTop;
  }
  return pcVar5;
}

Assistant:

inline char* ContinuousPageStack<InitialPageCount>::Pop(const size_t size)
{
    if (nextTop == 0)
        return 0;
    else
    {
        Assert(size != 0);
        Assert(nextTop >= size);
        nextTop -= size;
        return Buffer() + nextTop;
    }
}